

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToExponential
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  long lVar1;
  bool bVar2;
  char *in_RDX;
  DtoaMode in_ESI;
  StringBuilder *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int exponent;
  bool unique_zero;
  int i;
  int kDecimalRepCapacity;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [122];
  double in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int buffer_length;
  int in_stack_ffffffffffffff48;
  bool local_9d;
  undefined1 local_88 [88];
  int *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Double::Double((Double *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
  bVar2 = Double::IsSpecial((Double *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20))
  ;
  if (bVar2) {
    local_9d = HandleSpecialValues((DoubleToStringConverter *)
                                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                   (double)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),in_RDI);
  }
  else if ((int)in_ESI < -1) {
    local_9d = false;
  }
  else if ((int)in_ESI < 0x79) {
    buffer_length = 0x7a;
    memset(local_88,0xaa,0x7a);
    if (in_ESI == ~SHORTEST) {
      DoubleToAscii(in_XMM0_Qa,~SHORTEST,in_stack_ffffffffffffff48,in_RDX,buffer_length,
                    (bool *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int *)in_RDI,in_stack_ffffffffffffffd0);
    }
    else {
      DoubleToAscii(in_XMM0_Qa,in_ESI,in_stack_ffffffffffffff48,in_RDX,buffer_length,
                    (bool *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (int *)in_RDI,in_stack_ffffffffffffffd0);
      for (in_stack_ffffffffffffff38 = -0x55555556;
          in_stack_ffffffffffffff38 < (int)(in_ESI + SHORTEST_SINGLE);
          in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 + 1) {
        local_88[in_stack_ffffffffffffff38] = 0x30;
      }
    }
    CreateExponentialRepresentation
              ((DoubleToStringConverter *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),in_RDX,
               buffer_length,in_stack_ffffffffffffff38,
               (StringBuilder *)
               CONCAT44(CONCAT13((*(uint *)in_RDI & 8) != 0,(int3)in_stack_ffffffffffffff34),
                        0xaaaaaaa9));
    local_9d = true;
  }
  else {
    local_9d = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9d;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToExponential(
    double value,
    int requested_digits,
    StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits < -1) return false;
  if (requested_digits > kMaxExponentialDigits) return false;

  int decimal_point;
  bool sign;
  // Add space for digit before the decimal point and the '\0' character.
  const int kDecimalRepCapacity = kMaxExponentialDigits + 2;
  DOUBLE_CONVERSION_ASSERT(kDecimalRepCapacity > kBase10MaximalLength);
  char decimal_rep[kDecimalRepCapacity];
#ifndef NDEBUG
  // Problem: there is an assert in StringBuilder::AddSubstring() that
  // will pass this buffer to strlen(), and this buffer is not generally
  // null-terminated.
  memset(decimal_rep, 0, sizeof(decimal_rep));
#endif
  int decimal_rep_length;

  if (requested_digits == -1) {
    DoubleToAscii(value, SHORTEST, 0,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
  } else {
    DoubleToAscii(value, PRECISION, requested_digits + 1,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
    DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= requested_digits + 1);

    for (int i = decimal_rep_length; i < requested_digits + 1; ++i) {
      decimal_rep[i] = '0';
    }
    decimal_rep_length = requested_digits + 1;
  }

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  CreateExponentialRepresentation(decimal_rep,
                                  decimal_rep_length,
                                  exponent,
                                  result_builder);
  return true;
}